

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::GenDefFile
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *real_link_commands)

{
  cmGeneratorTarget *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar1;
  bool bVar2;
  string *psVar3;
  ModuleDefinitionInfo *path;
  char *pcVar4;
  ostream *poVar5;
  pointer ppcVar6;
  pointer pbVar7;
  string objlist_file;
  string cmd;
  cmGeneratedFileStream fout;
  allocator local_2f9;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  cmGeneratedFileStream local_278;
  
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  psVar3 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator);
  path = cmGeneratorTarget::GetModuleDefinitionInfo(this_00,psVar3);
  if ((path != (ModuleDefinitionInfo *)0x0) && (path->DefFileGenerated == true)) {
    psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::string((string *)&local_2b8,(string *)psVar3);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&local_278,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_2b8,SHELL);
    std::__cxx11::string::operator=((string *)&local_2b8,(string *)&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::append((char *)&local_2b8);
    pcVar1 = this->LocalGenerator;
    pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)pcVar1);
    std::__cxx11::string::string((string *)&local_2d8,pcVar4,(allocator *)&local_298);
    cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
              (&local_2f8,pcVar1,&local_2d8,&path->DefFile);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&local_278,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_2f8,SHELL);
    std::__cxx11::string::append((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::append((char *)&local_2b8);
    std::operator+(&local_2f8,&path->DefFile,".objs");
    pcVar1 = this->LocalGenerator;
    pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)pcVar1);
    std::__cxx11::string::string((string *)&local_298,pcVar4,&local_2f9);
    cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
              (&local_2d8,pcVar1,&local_298,&local_2f8);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&local_278,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_2d8,SHELL);
    std::__cxx11::string::append((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_298);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(real_link_commands,
             (real_link_commands->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,&local_2b8);
    cmGeneratedFileStream::cmGeneratedFileStream(&local_278,local_2f8._M_dataplus._M_p,false,None);
    if (path->WindowsExportAllSymbols == true) {
      for (pbVar7 = (this->Objects).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar7 != (this->Objects).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
        bVar2 = cmHasLiteralSuffix<std::__cxx11::string,5ul>(pbVar7,(char (*) [5])".obj");
        if (bVar2) {
          poVar5 = std::operator<<((ostream *)&local_278,(string *)pbVar7);
          std::operator<<(poVar5,"\n");
        }
      }
      for (pbVar7 = (this->ExternalObjects).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar7 != (this->ExternalObjects).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
        poVar5 = std::operator<<((ostream *)&local_278,(string *)pbVar7);
        std::operator<<(poVar5,"\n");
      }
    }
    for (ppcVar6 = (path->Sources).
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppcVar6 !=
        (path->Sources).
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar6 = ppcVar6 + 1) {
      psVar3 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar6);
      poVar5 = std::operator<<((ostream *)&local_278,(string *)psVar3);
      std::operator<<(poVar5,"\n");
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2b8);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::GenDefFile(
  std::vector<std::string>& real_link_commands)
{
  cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
    this->GeneratorTarget->GetModuleDefinitionInfo(this->GetConfigName());
  if (!mdi || !mdi->DefFileGenerated) {
    return;
  }
  std::string cmd = cmSystemTools::GetCMakeCommand();
  cmd =
    this->LocalGenerator->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL);
  cmd += " -E __create_def ";
  cmd += this->LocalGenerator->ConvertToOutputFormat(
    this->LocalGenerator->MaybeConvertToRelativePath(
      this->LocalGenerator->GetCurrentBinaryDirectory(), mdi->DefFile),
    cmOutputConverter::SHELL);
  cmd += " ";
  std::string objlist_file = mdi->DefFile + ".objs";
  cmd += this->LocalGenerator->ConvertToOutputFormat(
    this->LocalGenerator->MaybeConvertToRelativePath(
      this->LocalGenerator->GetCurrentBinaryDirectory(), objlist_file),
    cmOutputConverter::SHELL);
  real_link_commands.insert(real_link_commands.begin(), cmd);
  // create a list of obj files for the -E __create_def to read
  cmGeneratedFileStream fout(objlist_file.c_str());

  if (mdi->WindowsExportAllSymbols) {
    for (std::vector<std::string>::const_iterator i = this->Objects.begin();
         i != this->Objects.end(); ++i) {
      if (cmHasLiteralSuffix(*i, ".obj")) {
        fout << *i << "\n";
      }
    }
    for (std::vector<std::string>::const_iterator i =
           this->ExternalObjects.begin();
         i != this->ExternalObjects.end(); ++i) {
      fout << *i << "\n";
    }
  }

  for (std::vector<cmSourceFile const*>::const_iterator i =
         mdi->Sources.begin();
       i != mdi->Sources.end(); ++i) {
    fout << (*i)->GetFullPath() << "\n";
  }
}